

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

sptr __thiscall pstack::Context::getDwarf(Context *this,sptr *object)

{
  iterator iVar1;
  __shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2> *this_00;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  sptr sVar3;
  
  iVar1 = std::
          _Rb_tree<std::shared_ptr<pstack::Elf::Object>,_std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
          ::find((_Rb_tree<std::shared_ptr<pstack::Elf::Object>,_std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
                  *)object,in_RDX);
  dwarfLookups = dwarfLookups + 1;
  if (iVar1._M_node ==
      (_Base_ptr)
      &(object->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount) {
    std::make_shared<pstack::Dwarf::Info,std::shared_ptr<pstack::Elf::Object>&>
              ((shared_ptr<pstack::Elf::Object> *)this);
    this_00 = &std::
               map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
               ::operator[]((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
                             *)object,in_RDX)->
               super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2> *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    dwarfHits = dwarfHits + 1;
    std::__shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2> *)
               &iVar1._M_node[1]._M_left);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sptr)sVar3.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Dwarf::Info::sptr
Context::getDwarf(Elf::Object::sptr object)
{
    auto it = dwarfCache.find(object);
    dwarfLookups++;
    if (it != dwarfCache.end()) {
        dwarfHits++;
        return it->second;
    }
    auto dwarf = std::make_shared<Dwarf::Info>(object);
    dwarfCache[object] = dwarf;
    return dwarf;
}